

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O1

int fiobj_ary_remove2(FIOBJ ary,FIOBJ data)

{
  void *__dest;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((((ary == 0) || ((~(uint)ary & 6) == 0)) || ((ary & 1) != 0)) ||
     (*(char *)(ary & 0xfffffffffffffff8) != ')')) {
    __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                  ,0xe6,"int fiobj_ary_remove2(FIOBJ, FIOBJ)");
  }
  uVar1 = *(ulong *)(ary + 8);
  uVar5 = *(ulong *)(ary + 0x10);
  uVar4 = uVar5 - uVar1;
  uVar6 = 0xffffffffffffffff;
  if (uVar4 != 0) {
    uVar7 = uVar1;
    if (uVar1 <= uVar5 && uVar4 != 0) {
      uVar6 = uVar1;
      do {
        uVar7 = uVar6;
        if (*(FIOBJ *)(*(long *)(ary + 0x20) + uVar6 * 8) == data) break;
        uVar6 = uVar6 + 1;
        uVar7 = uVar5;
      } while (uVar5 != uVar6);
    }
    uVar6 = 0xffffffffffffffff;
    if (uVar7 != uVar5) {
      uVar6 = uVar7 - uVar1;
    }
  }
  bVar2 = true;
  if (uVar6 != 0xffffffffffffffff) {
    uVar7 = uVar6;
    if ((long)uVar6 < 0) {
      uVar7 = uVar6 + uVar4;
      if ((long)(uVar6 + uVar4) < 1) {
        uVar7 = 0;
      }
    }
    if (uVar7 < uVar4) {
      uVar6 = uVar7 + uVar1;
      data = *(FIOBJ *)(*(long *)(ary + 0x20) + uVar6 * 8);
      if (uVar7 == 0) {
        *(ulong *)(ary + 8) = uVar1 + 1;
      }
      else {
        uVar5 = uVar5 - 1;
        *(ulong *)(ary + 0x10) = uVar5;
        if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
          __dest = (void *)(*(long *)(ary + 0x20) + uVar6 * 8);
          memmove(__dest,(void *)((long)__dest + 8),(uVar5 - uVar6) * 8);
        }
      }
      bVar2 = false;
    }
  }
  iVar3 = -1;
  if (!bVar2) {
    fiobj_free(data);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int fiobj_ary_remove2(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  if (-1 == fio_ary___remove2(&obj2ary(ary)->ary, data, &data)) {
    return -1;
  }
  fiobj_free(data);
  return 0;
}